

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11.cpp
# Opt level: O3

void __thiscall
tcu::x11::XlibDisplay::XlibDisplay(XlibDisplay *this,EventState *eventState,char *name)

{
  Display *pDVar1;
  Atom AVar2;
  ResourceError *this_00;
  
  (this->super_DisplayBase).m_eventState = eventState;
  (this->super_DisplayBase)._vptr_DisplayBase = (_func_int **)&PTR__XlibDisplay_020c8878;
  pDVar1 = (Display *)XOpenDisplay(name);
  this->m_display = pDVar1;
  if (pDVar1 != (Display *)0x0) {
    AVar2 = XInternAtom(pDVar1,"WM_DELETE_WINDOW",0);
    this->m_deleteAtom = AVar2;
    return;
  }
  this_00 = (ResourceError *)__cxa_allocate_exception(0x38);
  ResourceError::ResourceError
            (this_00,"Failed to open display",name,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/platform/X11/tcuX11.cpp"
             ,0x4f);
  __cxa_throw(this_00,&ResourceError::typeinfo,Exception::~Exception);
}

Assistant:

XlibDisplay::XlibDisplay (EventState& eventState, const char* name)
	: DisplayBase	(eventState)
{
	m_display = XOpenDisplay((char*)name); // Won't modify argument string.
	if (!m_display)
		throw ResourceError("Failed to open display", name, __FILE__, __LINE__);

	m_deleteAtom	= XInternAtom(m_display, "WM_DELETE_WINDOW", False);
}